

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  element_type *peVar1;
  bool bVar2;
  ostream *poVar3;
  int x;
  char *pcVar4;
  Error err;
  shared_ptr<fake::ErrLERandNum1> rerr;
  
  for (x = -1; x != 5; x = x + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Handling ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,x);
    std::operator<<(poVar3,":\n");
    fake::MyFakeAPI::Call((MyFakeAPI *)&err,x);
    if (err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::operator<<((ostream *)&std::cout,"Nothing happened\n");
    }
    else {
      gerr::As<fake::ErrLERandNum1,gerr::details::IError,void>
                ((gerr *)&rerr,(shared_ptr<gerr::details::IError> *)&err);
      peVar1 = rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        bVar2 = gerr::Is<fake::ErrArgumentZero,gerr::details::IError,void>
                          ((shared_ptr<gerr::details::IError> *)&err);
        poVar3 = (ostream *)&std::cout;
        pcVar4 = "I don\'t care arg zero error\n";
        if (!bVar2) {
          bVar2 = gerr::IsCode<gerr::details::IError,void>
                            (0x7b,(shared_ptr<gerr::details::IError> *)&err);
          poVar3 = (ostream *)&std::cout;
          pcVar4 = "I don\'t care a dummy error";
          if (!bVar2) {
            poVar3 = gerr::details::operator<<
                               ((ostream *)&std::cerr,
                                err.
                                super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
            pcVar4 = "\n";
          }
        }
        std::operator<<(poVar3,pcVar4);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"ErrLERandNum, rand val1:");
        poVar3 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar3,(peVar1->__contexT__).randNum1);
        poVar3 = std::operator<<(poVar3,";");
        poVar3 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar3,(peVar1->__contexT__).randNum2);
        std::operator<<(poVar3,"\n");
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return 0;
}

Assistant:

int main() {
  for (int i = -1; i < 5; i++) {
    std::cout << "Handling " << i << ":\n";
    auto const err = fake::MyFakeAPI::Call(i);
    if (err != nullptr) {
      auto const rerr = gerr::As<fake::ErrLERandNum1>(err);
      if (rerr != nullptr) {
        // 将通用错误转换为特定错误
        auto const &ctx = rerr->Context();
        std::cout << "ErrLERandNum, rand val1:" << ctx.randNum1 << ";"
                  << ctx.randNum2 << "\n";
      } else if (gerr::Is<fake::ErrArgumentZero>(err)) {
        // 检查一个错误是否是特定的错误，by type
        std::cout << "I don't care arg zero error\n";
      } else if (gerr::IsCode(123, err)) {
        // 检查一个错误是否是特定的错误，by error code
        std::cout << "I don't care a dummy error";
      } else {
        // 简单格式化错误链条并打印错误
        std::cerr << *err << "\n";
      }
    } else {
      std::cout << "Nothing happened\n";
    }
  }
  return 0;
}